

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O3

void parse_output_model(options_i *options,vw *all)

{
  int iVar1;
  option_group_definition *poVar2;
  ostream *poVar3;
  option_group_definition output_model_options;
  undefined1 *local_888 [2];
  undefined1 local_878 [16];
  string local_868;
  string local_848;
  undefined1 *local_828 [2];
  undefined1 local_818 [16];
  string local_808;
  undefined1 *local_7e8 [2];
  undefined1 local_7d8 [16];
  string local_7c8;
  undefined1 *local_7a8 [2];
  undefined1 local_798 [16];
  string local_788;
  undefined1 *local_768 [2];
  undefined1 local_758 [16];
  string local_748;
  undefined1 *local_728 [2];
  undefined1 local_718 [16];
  string local_708;
  undefined1 *local_6e8 [2];
  undefined1 local_6d8 [16];
  undefined1 *local_6c8 [2];
  undefined1 local_6b8 [16];
  string local_6a8;
  option_group_definition local_688;
  undefined1 *local_650 [2];
  undefined1 local_640 [16];
  string local_630;
  undefined1 *local_610 [2];
  undefined1 local_600 [16];
  undefined1 *local_5f0;
  long local_5e8;
  undefined1 local_5e0 [16];
  undefined1 local_5d0 [80];
  string local_580 [56];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_548;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_538;
  undefined1 local_530 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_498;
  undefined1 local_490 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_408;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3f8;
  undefined1 local_3f0 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_368;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_358;
  undefined1 local_350 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2b8;
  undefined1 local_2b0 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_228;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_218;
  undefined1 local_210 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_188;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_178;
  undefined1 local_170 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d8;
  undefined1 local_d0 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  local_5f0 = local_5e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5f0,"Output model","");
  local_688.m_name._M_dataplus._M_p = (pointer)&local_688.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_688,local_5f0,local_5f0 + local_5e8);
  local_688.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_688.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_688.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_5f0 != local_5e0) {
    operator_delete(local_5f0);
  }
  local_6a8._M_dataplus._M_p = (pointer)&local_6a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6a8,"final_regressor","");
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_5d0,&local_6a8,&all->final_regressor_name);
  local_6c8[0] = local_6b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6c8,"f","");
  std::__cxx11::string::_M_assign(local_580);
  local_6e8[0] = local_6d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6e8,"Final regressor","");
  std::__cxx11::string::_M_assign((string *)(local_5d0 + 0x30));
  poVar2 = VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
                     (&local_688,
                      (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_5d0);
  local_708._M_dataplus._M_p = (pointer)&local_708.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_708,"readable_model","");
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_d0,&local_708,&all->text_regressor_name);
  local_728[0] = local_718;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_728,"Output human-readable final regressor with numeric features","");
  std::__cxx11::string::_M_assign((string *)(local_d0 + 0x30));
  poVar2 = VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
                     (poVar2,(typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_d0);
  local_748._M_dataplus._M_p = (pointer)&local_748.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_748,"invert_hash","");
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_170,&local_748,&all->inv_hash_regressor_name);
  local_768[0] = local_758;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_768,
             "Output human-readable final regressor with feature names.  Computationally expensive."
             ,"");
  std::__cxx11::string::_M_assign((string *)(local_170 + 0x30));
  poVar2 = VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
                     (poVar2,(typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_170);
  local_788._M_dataplus._M_p = (pointer)&local_788.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_788,"save_resume","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_210,&local_788,&all->save_resume);
  local_7a8[0] = local_798;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_7a8,"save extra state so learning can be resumed later with new data",
             "");
  std::__cxx11::string::_M_assign((string *)(local_210 + 0x30));
  poVar2 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar2,(typed_option<bool> *)local_210);
  local_7c8._M_dataplus._M_p = (pointer)&local_7c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_7c8,"preserve_performance_counters","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_2b0,&local_7c8,&all->preserve_performance_counters);
  local_7e8[0] = local_7d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_7e8,"reset performance counters when warmstarting","");
  std::__cxx11::string::_M_assign((string *)(local_2b0 + 0x30));
  poVar2 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar2,(typed_option<bool> *)local_2b0);
  local_808._M_dataplus._M_p = (pointer)&local_808.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_808,"save_per_pass","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_350,&local_808,&all->save_per_pass);
  local_828[0] = local_818;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_828,"Save the model after every pass over data","");
  std::__cxx11::string::_M_assign((string *)(local_350 + 0x30));
  poVar2 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar2,(typed_option<bool> *)local_350);
  local_848._M_dataplus._M_p = (pointer)&local_848.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_848,"output_feature_regularizer_binary","");
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_3f0,&local_848,&all->per_feature_regularizer_output);
  local_610[0] = local_600;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_610,"Per feature regularization output file","");
  std::__cxx11::string::_M_assign((string *)(local_3f0 + 0x30));
  poVar2 = VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
                     (poVar2,(typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_3f0);
  local_868._M_dataplus._M_p = (pointer)&local_868.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_868,"output_feature_regularizer_text","");
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_490,&local_868,&all->per_feature_regularizer_text);
  local_888[0] = local_878;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_888,"Per feature regularization output file, in text","");
  std::__cxx11::string::_M_assign((string *)(local_490 + 0x30));
  poVar2 = VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
                     (poVar2,(typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_490);
  local_630._M_dataplus._M_p = (pointer)&local_630.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_630,"id","");
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_530,&local_630,&all->id);
  local_650[0] = local_640;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_650,"User supplied ID embedded into the final regressor","");
  std::__cxx11::string::_M_assign((string *)(local_530 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (poVar2,(typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_530);
  if (local_650[0] != local_640) {
    operator_delete(local_650[0]);
  }
  local_530._0_8_ = &PTR__typed_option_002dc140;
  if (local_498._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_498._M_pi);
  }
  if (local_4a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4a8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_530);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_630._M_dataplus._M_p != &local_630.field_2) {
    operator_delete(local_630._M_dataplus._M_p);
  }
  if (local_888[0] != local_878) {
    operator_delete(local_888[0]);
  }
  local_490._0_8_ = &PTR__typed_option_002dc140;
  if (local_3f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3f8._M_pi);
  }
  if (local_408._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_408._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_490);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_868._M_dataplus._M_p != &local_868.field_2) {
    operator_delete(local_868._M_dataplus._M_p);
  }
  if (local_610[0] != local_600) {
    operator_delete(local_610[0]);
  }
  local_3f0._0_8_ = &PTR__typed_option_002dc140;
  if (local_358._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_358._M_pi);
  }
  if (local_368._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_368._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_3f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_848._M_dataplus._M_p != &local_848.field_2) {
    operator_delete(local_848._M_dataplus._M_p);
  }
  if (local_828[0] != local_818) {
    operator_delete(local_828[0]);
  }
  local_350._0_8_ = &PTR__typed_option_002dc108;
  if (local_2b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2b8._M_pi);
  }
  if (local_2c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2c8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_350);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_808._M_dataplus._M_p != &local_808.field_2) {
    operator_delete(local_808._M_dataplus._M_p);
  }
  if (local_7e8[0] != local_7d8) {
    operator_delete(local_7e8[0]);
  }
  local_2b0._0_8_ = &PTR__typed_option_002dc108;
  if (local_218._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_218._M_pi);
  }
  if (local_228._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_228._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_2b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
    operator_delete(local_7c8._M_dataplus._M_p);
  }
  if (local_7a8[0] != local_798) {
    operator_delete(local_7a8[0]);
  }
  local_210._0_8_ = &PTR__typed_option_002dc108;
  if (local_178._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_178._M_pi);
  }
  if (local_188._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_188._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_210);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_788._M_dataplus._M_p != &local_788.field_2) {
    operator_delete(local_788._M_dataplus._M_p);
  }
  if (local_768[0] != local_758) {
    operator_delete(local_768[0]);
  }
  local_170._0_8_ = &PTR__typed_option_002dc140;
  if (local_d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8._M_pi);
  }
  if (local_e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_748._M_dataplus._M_p != &local_748.field_2) {
    operator_delete(local_748._M_dataplus._M_p);
  }
  if (local_728[0] != local_718) {
    operator_delete(local_728[0]);
  }
  local_d0._0_8_ = &PTR__typed_option_002dc140;
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
  }
  if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_708._M_dataplus._M_p != &local_708.field_2) {
    operator_delete(local_708._M_dataplus._M_p);
  }
  if (local_6e8[0] != local_6d8) {
    operator_delete(local_6e8[0]);
  }
  if (local_6c8[0] != local_6b8) {
    operator_delete(local_6c8[0]);
  }
  local_5d0._0_8_ = &PTR__typed_option_002dc140;
  if (local_538._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_538._M_pi);
  }
  if (local_548._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_548._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_5d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6a8._M_dataplus._M_p != &local_6a8.field_2) {
    operator_delete(local_6a8._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,&local_688);
  iVar1 = std::__cxx11::string::compare((char *)&all->final_regressor_name);
  if ((iVar1 != 0) && (all->quiet == false)) {
    std::__ostream_insert<char,std::char_traits<char>>
              (&(all->trace_message).super_ostream,"final_regressor = ",0x12);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (&(all->trace_message).super_ostream,
                        (all->final_regressor_name)._M_dataplus._M_p,
                        (all->final_regressor_name)._M_string_length);
    std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  local_5d0._0_8_ = local_5d0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5d0,"invert_hash","");
  iVar1 = (*options->_vptr_options_i[1])(options,local_5d0);
  if ((undefined1 *)local_5d0._0_8_ != local_5d0 + 0x10) {
    operator_delete((void *)local_5d0._0_8_);
  }
  if ((char)iVar1 != '\0') {
    all->hash_inv = true;
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_688.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_688.m_name._M_dataplus._M_p != &local_688.m_name.field_2) {
    operator_delete(local_688.m_name._M_dataplus._M_p);
  }
  return;
}

Assistant:

void parse_output_model(options_i& options, vw& all)
{
  option_group_definition output_model_options("Output model");
  output_model_options
      .add(make_option("final_regressor", all.final_regressor_name).short_name("f").help("Final regressor"))
      .add(make_option("readable_model", all.text_regressor_name)
               .help("Output human-readable final regressor with numeric features"))
      .add(make_option("invert_hash", all.inv_hash_regressor_name)
               .help("Output human-readable final regressor with feature names.  Computationally expensive."))
      .add(make_option("save_resume", all.save_resume)
               .help("save extra state so learning can be resumed later with new data"))
      .add(make_option("preserve_performance_counters", all.preserve_performance_counters)
               .help("reset performance counters when warmstarting"))
      .add(make_option("save_per_pass", all.save_per_pass).help("Save the model after every pass over data"))
      .add(make_option("output_feature_regularizer_binary", all.per_feature_regularizer_output)
               .help("Per feature regularization output file"))
      .add(make_option("output_feature_regularizer_text", all.per_feature_regularizer_text)
               .help("Per feature regularization output file, in text"))
      .add(make_option("id", all.id).help("User supplied ID embedded into the final regressor"));
  options.add_and_parse(output_model_options);

  if (all.final_regressor_name.compare("") && !all.quiet)
    all.trace_message << "final_regressor = " << all.final_regressor_name << endl;

  if (options.was_supplied("invert_hash"))
    all.hash_inv = true;

  // Question: This doesn't seem necessary
  // if (options.was_supplied("id") && find(arg.args.begin(), arg.args.end(), "--id") == arg.args.end())
  // {
  //   arg.args.push_back("--id");
  //   arg.args.push_back(arg.vm["id"].as<string>());
  // }
}